

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

OutputWorker * logger::OutputWorker::GetInstance(void)

{
  int iVar1;
  long *in_FS_OFFSET;
  undefined1 local_19;
  undefined1 *local_18;
  
  if (GetInstance()::instance == '\0') {
    GetInstance();
  }
  local_18 = &local_19;
  *in_FS_OFFSET = (long)&local_18;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&GetInstance::m_singletonFlag._M_once,__once_proxy);
  if (iVar1 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    return (OutputWorker *)
           (__uniq_ptr_impl<logger::OutputWorker,_std::default_delete<logger::OutputWorker>_>)
           GetInstance::instance._M_t.
           super___uniq_ptr_impl<logger::OutputWorker,_std::default_delete<logger::OutputWorker>_>.
           _M_t.
           super__Tuple_impl<0UL,_logger::OutputWorker_*,_std::default_delete<logger::OutputWorker>_>
           .super__Head_base<0UL,_logger::OutputWorker_*,_false>._M_head_impl;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

OutputWorker& OutputWorker::GetInstance()
{
    // Fix crash on shutdown due to MSVCRT bug prior to version 2015
    static std::once_flag m_singletonFlag;
    static std::unique_ptr<OutputWorker> instance;

    std::call_once(m_singletonFlag, []()
    {
        instance.reset(new OutputWorker);
    });

    return *instance.get();
}